

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6526.hpp
# Opt level: O3

void __thiscall
MOS::MOS6526::MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1>::MOS6526
          (MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1> *this,
          CIAAHandler *port_handler)

{
  long lVar1;
  
  (this->super_MOS6526Storage).cnt_state_ = false;
  (this->super_MOS6526Storage).cnt_edge_ = false;
  (this->super_MOS6526Storage).flag_state_ = false;
  (this->super_MOS6526Storage).half_divider_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->super_MOS6526Storage).output_[0] = '\0';
  (this->super_MOS6526Storage).output_[1] = '\0';
  (this->super_MOS6526Storage).data_direction_[0] = '\0';
  (this->super_MOS6526Storage).data_direction_[1] = '\0';
  (this->super_MOS6526Storage).interrupt_control_ = '\0';
  (this->super_MOS6526Storage).interrupt_state_ = '\0';
  (this->super_MOS6526Storage).shift_data_ = '\0';
  (this->super_MOS6526Storage).shift_register_ = '\0';
  (this->super_MOS6526Storage).interrupt_state_ = '\0';
  (this->super_MOS6526Storage).shift_data_ = '\0';
  (this->super_MOS6526Storage).shift_register_ = '\0';
  (this->super_MOS6526Storage).shift_bits_ = 0;
  (this->super_MOS6526Storage).shifter_is_output_ = false;
  lVar1 = 0x28;
  do {
    *(undefined4 *)((this->super_MOS6526Storage).output_ + lVar1 + -0x18) = 0;
    (this->super_MOS6526Storage).output_[lVar1 + -0x14] = '\0';
    *(undefined4 *)((this->super_MOS6526Storage).output_ + lVar1 + -0x10) = 0;
    lVar1 = lVar1 + 0xc;
  } while (lVar1 != 0x40);
  (this->super_MOS6526Storage).pending_ = 0;
  (this->super_ReadDelegate)._vptr_ReadDelegate =
       (_func_int **)&PTR_serial_line_did_produce_bit_00590df8;
  (this->serial_input).events_.
  super__Vector_base<Serial::Line<true>::Event,_std::allocator<Serial::Line<true>::Event>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->serial_input).events_.
  super__Vector_base<Serial::Line<true>::Event,_std::allocator<Serial::Line<true>::Event>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->serial_input).events_.
  super__Vector_base<Serial::Line<true>::Event,_std::allocator<Serial::Line<true>::Event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->serial_input).remaining_delays_ = 0;
  (this->serial_input).transmission_extra_ = 0;
  (this->serial_input).level_ = true;
  (this->serial_input).clock_rate_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->serial_input).read_delegate_ = (ReadDelegate *)0x0;
  (this->serial_input).read_delegate_bit_length_.length = 0;
  *(undefined8 *)&(this->serial_input).read_delegate_bit_length_.clock_rate = 1;
  *(undefined8 *)&(this->serial_input).time_left_in_bit_.clock_rate = 1;
  (this->serial_input).read_delegate_phase_ = WaitingForZero;
  this->port_handler_ = port_handler;
  (this->tod_).super_TODBase.write_alarm = false;
  (this->tod_).super_TODBase.is_50Hz = false;
  (this->tod_).increment_mask_ = 0xffffffff;
  (this->tod_).latch_ = 0;
  (this->tod_).value_ = 0;
  (this->tod_).alarm_ = 0xffffff;
  Serial::Line<true>::set_read_delegate
            (&this->serial_input,&this->super_ReadDelegate,(Time)0x100000000);
  return;
}

Assistant:

MOS6526(PortHandlerT &port_handler) noexcept : port_handler_(port_handler) {
			serial_input.set_read_delegate(this);
		}